

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scrambler.cxx
# Opt level: O3

int __thiscall xray_re::xr_scrambler::init(xr_scrambler *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  
  if ((int)ctx == 1) {
    this->m_seed = 0x16eb2eb;
    init_sboxes(this,0x5bbc4b,4);
    return extraout_EAX_00;
  }
  if ((int)ctx == 0) {
    this->m_seed = 0x131a9d3;
    init_sboxes(this,0x1329436,8);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void xr_scrambler::init(cipher_config cc)
{
	if (cc == CC_RU) {
		m_seed = SEED_RU;
		init_sboxes(SEED0_RU, SIZE_MULT_RU);
	} else if (cc == CC_WW) {
		m_seed = SEED_WW;
		init_sboxes(SEED0_WW, SIZE_MULT_WW);
	}
}